

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::GetExecutableNames
          (cmTarget *this,string *name,string *realName,string *impName,string *pdbName,
          string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  string msg;
  string suffix;
  string base;
  string prefix;
  string local_110;
  string *local_f0;
  string *local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_110.field_2;
  local_f0 = realName;
  local_e8 = name;
  local_58 = impName;
  if (this->IsImportedTarget == true) {
    local_80._M_dataplus._M_p = (pointer)0x2e;
    local_110._M_dataplus._M_p = (pointer)paVar1;
    local_110._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_80);
    local_110.field_2._M_allocated_capacity = (size_type)local_80._M_dataplus._M_p;
    builtin_strncpy(local_110._M_dataplus._M_p,"GetExecutableNames called on imported target: ",0x2e
                   );
    local_110._M_string_length = (size_type)local_80._M_dataplus._M_p;
    local_110._M_dataplus._M_p[(long)local_80._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)(this->Name)._M_dataplus._M_p);
    cmMakefile::IssueMessage(this->Makefile,INTERNAL_ERROR,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  local_110._M_string_length = 7;
  local_110.field_2._M_allocated_capacity = 0x4e4f4953524556;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  local_60 = pdbName;
  pcVar3 = GetProperty(this,&local_110,this->Makefile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  bVar2 = true;
  if (this->TargetTypeValue == EXECUTABLE) {
    local_110.field_2._M_allocated_capacity._0_6_ = 0x45444f4358;
    local_110._M_string_length = 5;
    local_110._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = cmMakefile::IsOn(this->Makefile,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar2 != false) {
    pcVar3 = (char *)0x0;
  }
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  GetFullNameInternal(this,config,false,&local_80,&local_a0,&local_c0);
  std::operator+(&local_50,&local_80,&local_a0);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_c0._M_dataplus._M_p);
  paVar1 = &local_e0.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_e0.field_2._M_allocated_capacity = *psVar5;
    local_e0.field_2._8_8_ = plVar4[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar5;
    local_e0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_e0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_e8,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)local_f0);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::append((char *)local_f0);
    std::__cxx11::string::append((char *)local_f0);
  }
  GetFullNameInternal(&local_e0,this,config,true);
  std::__cxx11::string::operator=((string *)local_58,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  GetPDBName(&local_e0,this,config);
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmTarget::GetExecutableNames(std::string& name,
                                  std::string& realName,
                                  std::string& impName,
                                  std::string& pdbName,
                                  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if(this->IsImported())
    {
    std::string msg =
      "GetExecutableNames called on imported target: ";
    msg += this->GetName();
    this->GetMakefile()->IssueMessage(cmake::INTERNAL_ERROR, msg);
    }

  // This versioning is supported only for executables and then only
  // when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char* version = 0;
#else
  // Check for executable version properties.
  const char* version = this->GetProperty("VERSION");
  if(this->GetType() != cmTarget::EXECUTABLE || this->Makefile->IsOn("XCODE"))
    {
    version = 0;
    }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, false, prefix, base, suffix);

  // The executable name.
  name = prefix+base+suffix;

  // The executable's real name on disk.
#if defined(__CYGWIN__)
  realName = prefix+base;
#else
  realName = name;
#endif
  if(version)
    {
    realName += "-";
    realName += version;
    }
#if defined(__CYGWIN__)
  realName += suffix;
#endif

  // The import library name.
  impName = this->GetFullNameInternal(config, true);

  // The program database file name.
  pdbName = this->GetPDBName(config);
}